

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O0

void test_send_pong_frame_payload_too_large(void)

{
  cio_error cVar1;
  size_t actual;
  undefined1 local_c8 [4];
  cio_error err;
  cio_write_buffer wb;
  cio_write_buffer wbh;
  char buffer [126];
  
  memset((void *)((long)&wbh.data + 8),0,0x7e);
  wbh.data.element.length._0_1_ = 0x61;
  cio_write_buffer_head_init((cio_write_buffer *)((long)&wb.data + 8));
  cio_write_buffer_element_init((cio_write_buffer *)local_c8,(void *)((long)&wbh.data + 8),0x7e);
  cio_write_buffer_queue_tail((cio_write_buffer *)((long)&wb.data + 8),(cio_write_buffer *)local_c8)
  ;
  cVar1 = cio_websocket_write_pong
                    (ws,(cio_write_buffer *)((long)&wb.data + 8),write_handler,(void *)0x0);
  UnityAssertEqualNumber
            (-0x16,(long)cVar1,"Writing a pong frame did not succeed!",0x9a8,UNITY_DISPLAY_STYLE_INT
            );
  UnityAssertEqualNumber
            (0,(ulong)write_handler_fake.call_count,"Write handler was called",0x9a9,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(ulong)on_error_fake.call_count,"error callback was called",0x9ab,
             UNITY_DISPLAY_STYLE_INT);
  actual = cio_write_buffer_get_num_buffer_elements((cio_write_buffer *)((long)&wb.data + 8));
  UnityAssertEqualNumber
            (1,actual,"Length of write buffer different than before writing!",0x9ad,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)((long)&wb.data + 8),*(UNITY_INT *)wb.data.element.length,
             "Concatenation of write buffers no longer correct after writing!",0x9ae,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualMemory
            ((void *)((long)&wbh.data + 8),*(void **)(wb.data.element.length + 0x10),0x7e,1,
             "Content of writebuffer not correct after writing!",0x9af,UNITY_ARRAY_TO_ARRAY);
  return;
}

Assistant:

static void test_send_pong_frame_payload_too_large(void)
{
	char buffer[126] = {'a'};

	struct cio_write_buffer wbh;
	cio_write_buffer_head_init(&wbh);

	struct cio_write_buffer wb;
	cio_write_buffer_element_init(&wb, buffer, sizeof(buffer));
	cio_write_buffer_queue_tail(&wbh, &wb);

	enum cio_error err = cio_websocket_write_pong(ws, &wbh, write_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_INVALID_ARGUMENT, err, "Writing a pong frame did not succeed!");
	TEST_ASSERT_EQUAL_MESSAGE(0, write_handler_fake.call_count, "Write handler was called");

	TEST_ASSERT_EQUAL_MESSAGE(0, on_error_fake.call_count, "error callback was called");

	TEST_ASSERT_EQUAL_MESSAGE(1, cio_write_buffer_get_num_buffer_elements(&wbh), "Length of write buffer different than before writing!");
	TEST_ASSERT_EQUAL_MESSAGE(&wbh, wbh.next->next, "Concatenation of write buffers no longer correct after writing!");
	TEST_ASSERT_EQUAL_MEMORY_MESSAGE(buffer, wbh.next->data.element.data, sizeof(buffer), "Content of writebuffer not correct after writing!");
}